

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.hpp
# Opt level: O1

diff_out<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
 pstore::
 diff<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>,pstore::diff_dump::details::diff_out<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>>
           (database *db,
           hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
           *index,revision_number old,
           diff_out<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
           out)

{
  uint uVar1;
  typed_address<pstore::trailer> tVar2;
  traverser<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  t;
  database *local_38;
  hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
  *local_30;
  long local_28;
  
  if (old != 0xffffffff) {
    uVar1 = database::get_current_revision(db);
    if (old <= uVar1) {
      tVar2 = database::older_revision_footer_pos(db,old);
      local_28 = (long)tVar2.a_.a_ + 0x70;
      if ((index->root_).internal_ != (internal_node *)0x0) {
        local_38 = db;
        local_30 = index;
        out = diff_details::
              traverser<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
              ::
              visit_node<pstore::diff_dump::details::diff_out<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>>
                        ((traverser<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
                          *)&local_38,index->root_,0,out);
      }
    }
  }
  return (not_null<pstore::diff_dump::details::diff_out<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>::params_*>
          )out.p_.ptr_;
}

Assistant:

OutputIterator diff (database const & db, Index const & index, revision_number const old,
                         OutputIterator out) {
        if (old == pstore::head_revision || old > db.get_current_revision ()) {
            return out;
        }
        // addresses less than the threshold value are "old".
        diff_details::traverser<Index> t{db, index, (db.older_revision_footer_pos (old) + 1).to_address ()};
        return t (out);
    }